

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O0

void test_cap_styles(Am_Drawonable *d)

{
  Am_Style local_48 [8];
  Am_Style local_40 [24];
  Am_Style local_28 [8];
  Am_Style local_20 [8];
  int local_18;
  int local_14;
  int y;
  int n;
  Am_Drawonable *d_local;
  
  _y = d;
  (**(code **)(*(long *)d + 0x130))();
  (**(code **)(*(long *)_y + 0x130))(_y,&black,&white,0x60,6,8,8,0,0x168,0,1);
  (**(code **)(*(long *)_y + 0x140))(_y,&not_last,0x14,10,100,10,0);
  (**(code **)(*(long *)_y + 0x130))(_y,&black,&white,0x10,0x15,8,8,0,0x168,0,1);
  (**(code **)(*(long *)_y + 0x130))(_y,&black,&white,0x60,0x15,8,8,0,0x168,0,1);
  (**(code **)(*(long *)_y + 0x140))(_y,&black,0x14,0x19,100,0x19,0);
  Am_Style::Am_Style(local_20,(Am_Style *)&butt);
  Am_Style::Am_Style(local_28,(Am_Style *)&round_ls);
  Am_Style::Am_Style(local_40,(Am_Style *)&projecting);
  Am_Style::Am_Style(local_48,(Am_Style *)&Am_No_Style);
  set_style_array(local_20,local_28,local_40,local_48);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_28);
  Am_Style::~Am_Style(local_20);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    local_18 = local_14 * 0x28 + 0x32;
    (**(code **)(*(long *)_y + 0x140))
              (_y,style_array + (long)local_14 * 8,0x14,local_18,100,local_18,0);
    (**(code **)(*(long *)_y + 0x140))(_y,&white,0x14,local_18,100,local_18,0);
    (**(code **)(*(long *)_y + 0x130))(_y,&black,&white,0x10,local_18 + -4,8,8,0,0x168,0,1);
    (**(code **)(*(long *)_y + 0x130))(_y,&black,&white,0x60,local_18 + -4,8,8,0,0x168,0,1);
  }
  return;
}

Assistant:

void
test_cap_styles(Am_Drawonable *d)
{
  // A line whose last endpoint is not drawn by virtue of the not_last flag
  d->Draw_Arc(black, white, 16, 6, 8, 8, 0, 360);
  d->Draw_Arc(black, white, 96, 6, 8, 8, 0, 360);
  d->Draw_Line(not_last, 20, 10, 100, 10);

  // A line for comparing the not_last line against (use xmag)
  d->Draw_Arc(black, white, 16, 21, 8, 8, 0, 360);
  d->Draw_Arc(black, white, 96, 21, 8, 8, 0, 360);
  d->Draw_Line(black, 20, 25, 100, 25);

  // Draw three thick lines, each with different cap styles
  int n, y;
  set_style_array(butt, round_ls, projecting);
  for (n = 0; n <= 2; n++) {
    y = 50 + (40 * n);
    d->Draw_Line(style_array[n], 20, y, 100, y);
    d->Draw_Line(white, 20, y, 100, y);
    d->Draw_Arc(black, white, 16, y - 4, 8, 8, 0, 360);
    d->Draw_Arc(black, white, 96, y - 4, 8, 8, 0, 360);
  }
}